

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

unrecognized_param * __thiscall
boost::runtime::
specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::operator<<
          (unrecognized_param *__return_storage_ptr__,
          specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
          *this,char *val)

{
  std::__cxx11::string::append((char *)&(this->super_input_error).super_param_error.msg);
  unrecognized_param::unrecognized_param(__return_storage_ptr__,(unrecognized_param *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }